

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O0

long __thiscall AmsRouter::AddRoute(AmsRouter *this,AmsNetId ams,string *host)

{
  bool bVar1;
  AmsConnection *pAVar2;
  pointer paVar3;
  reference this_00;
  pointer puVar4;
  pointer pAVar5;
  mapped_type *ppAVar6;
  pair<std::__detail::_Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>,_bool>
  pVar7;
  exception *e;
  _Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
  local_e0;
  undefined1 local_d8;
  _Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
  local_d0;
  pair<std::__detail::_Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>,_bool>
  conn_1;
  unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_> new_connection;
  unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_> *conn;
  iterator __end1;
  iterator __begin1;
  unordered_set<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_std::hash<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>,_std::equal_to<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>,_std::allocator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>_>
  *__range1;
  AmsConnection *oldConnection;
  unique_lock<std::recursive_mutex> lock;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  AddressList hostAddresses;
  string *host_local;
  AmsRouter *this_local;
  ulong uStack_10;
  AmsNetId ams_local;
  
  this_local._2_4_ = ams.b._0_4_;
  this_local._6_2_ = ams.b._4_2_;
  hostAddresses._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
  super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.super__Head_base<0UL,_addrinfo_*,_false>.
  _M_head_impl = (addrinfo *)host;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"48898",&local_59);
  bhf::ads::GetListOfAddresses((ads *)local_38,host,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)&oldConnection,&this->mutex);
  AwaitConnectionAttempts
            (this,(AmsNetId *)((long)&this_local + 2),
             (unique_lock<std::recursive_mutex> *)&oldConnection);
  pAVar2 = GetConnection(this,(AmsNetId *)((long)&this_local + 2));
  if (pAVar2 != (AmsConnection *)0x0) {
    paVar3 = std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::get
                       ((unique_ptr<addrinfo,_void_(*)(addrinfo_*)> *)local_38);
    bVar1 = AmsConnection::IsConnectedTo(pAVar2,paVar3);
    if (!bVar1) {
      uStack_10 = 0x506;
      goto LAB_0019fa9e;
    }
  }
  __end1 = std::
           unordered_set<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_std::hash<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>,_std::equal_to<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>,_std::allocator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>_>
           ::begin(&this->connections);
  conn = (unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_> *)
         std::
         unordered_set<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_std::hash<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>,_std::equal_to<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>,_std::allocator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>_>
         ::end(&this->connections);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                       ,(_Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                         *)&conn);
    if (!bVar1) break;
    this_00 = std::__detail::
              _Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
              ::operator*(&__end1);
    pAVar5 = std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>::operator->
                       (this_00);
    paVar3 = std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::get
                       ((unique_ptr<addrinfo,_void_(*)(addrinfo_*)> *)local_38);
    bVar1 = AmsConnection::IsConnectedTo(pAVar5,paVar3);
    if (bVar1) {
      pAVar5 = std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>::operator->
                         (this_00);
      std::__atomic_base<unsigned_long>::operator++
                (&(pAVar5->refCount).super___atomic_base<unsigned_long>,0);
      pAVar5 = std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>::get(this_00);
      ppAVar6 = std::
                map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
                ::operator[](&this->mapping,(key_type *)((long)&this_local + 2));
      *ppAVar6 = pAVar5;
      uStack_10 = 0;
      goto LAB_0019fa9e;
    }
    std::__detail::
    _Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
    ::operator++(&__end1);
  }
  std::
  map<AmsNetId,_std::tuple<>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
  ::operator[](&this->connection_attempts,(key_type *)((long)&this_local + 2));
  std::unique_lock<std::recursive_mutex>::unlock
            ((unique_lock<std::recursive_mutex> *)&oldConnection);
  pAVar2 = (AmsConnection *)operator_new(0x3918);
  paVar3 = std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::get
                     ((unique_ptr<addrinfo,_void_(*)(addrinfo_*)> *)local_38);
  AmsConnection::AmsConnection(pAVar2,&this->super_Router,paVar3);
  std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>::
  unique_ptr<std::default_delete<AmsConnection>,void>
            ((unique_ptr<AmsConnection,std::default_delete<AmsConnection>> *)&conn_1.second,pAVar2);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&oldConnection);
  std::
  map<AmsNetId,_std::tuple<>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
  ::erase(&this->connection_attempts,(key_type *)((long)&this_local + 2));
  std::_V2::condition_variable_any::notify_all(&this->connection_attempt_events);
  pVar7 = std::
          unordered_set<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::hash<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::equal_to<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::allocator<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>>
          ::emplace<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>
                    ((unordered_set<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::hash<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::equal_to<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::allocator<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>>
                      *)&this->connections,
                     (unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_> *)
                     &conn_1.second);
  local_e0._M_cur =
       (__node_type *)
       pVar7.first.
       super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
       ._M_cur;
  local_d8 = pVar7.second;
  local_d0._M_cur = local_e0._M_cur;
  conn_1.first.
  super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
  ._M_cur._0_1_ = local_d8;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uStack_10 = 0xffffffffffffffff;
  }
  else {
    bVar1 = AmsNetId::operator_cast_to_bool(&this->localAddr);
    if (!bVar1) {
      puVar4 = std::__detail::
               _Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
               ::operator->((_Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
                             *)&local_d0);
      pAVar5 = std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>::get(puVar4);
      AmsNetId::AmsNetId((AmsNetId *)((long)&e + 2),pAVar5->ownIp);
      *(undefined4 *)(this->localAddr).b = e._2_4_;
      *(undefined2 *)((this->localAddr).b + 4) = e._6_2_;
    }
    puVar4 = std::__detail::
             _Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
             ::operator->((_Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
                           *)&local_d0);
    pAVar5 = std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>::get(puVar4);
    std::__atomic_base<unsigned_long>::operator++
              (&(pAVar5->refCount).super___atomic_base<unsigned_long>,0);
    puVar4 = std::__detail::
             _Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
             ::operator->((_Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
                           *)&local_d0);
    pAVar5 = std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>::get(puVar4);
    ppAVar6 = std::
              map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
              ::operator[](&this->mapping,(key_type *)((long)&this_local + 2));
    *ppAVar6 = pAVar5;
    puVar4 = std::__detail::
             _Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
             ::operator->((_Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
                           *)&local_d0);
    pAVar5 = std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>::get(puVar4);
    uStack_10 = (ulong)((pAVar5->ownIp != 0 ^ 0xffU) & 1);
  }
  std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>::~unique_ptr
            ((unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_> *)&conn_1.second);
LAB_0019fa9e:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&oldConnection);
  std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::~unique_ptr
            ((unique_ptr<addrinfo,_void_(*)(addrinfo_*)> *)local_38);
  return uStack_10;
}

Assistant:

long AmsRouter::AddRoute(AmsNetId ams, const std::string& host)
{
    /**
        DNS lookups are pretty time consuming, we shouldn't do them
        with a looked mutex! So instead we do the lookup first and
        use the results, later.
     */
    auto hostAddresses = bhf::ads::GetListOfAddresses(host, "48898");

    std::unique_lock<std::recursive_mutex> lock(mutex);

    AwaitConnectionAttempts(ams, lock);

    const auto oldConnection = GetConnection(ams);
    if (oldConnection && !oldConnection->IsConnectedTo(hostAddresses.get())) {
        /**
           There is already a route for this AmsNetId, but with
           a different IP. The old route has to be deleted, first!
         */
        return ROUTERERR_PORTALREADYINUSE;
    }

    for (const auto& conn : connections) {
        if (conn->IsConnectedTo(hostAddresses.get())) {
            conn->refCount++;
            mapping[ams] = conn.get();
            return 0;
        }
    }

    connection_attempts[ams] = {};
    lock.unlock();

    try {
        auto new_connection = std::unique_ptr<AmsConnection>(new AmsConnection { *this, hostAddresses.get()});
        lock.lock();
        connection_attempts.erase(ams);
        connection_attempt_events.notify_all();

        auto conn = connections.emplace(std::move(new_connection));
        if (conn.second) {
            /** in case no local AmsNetId was set previously, we derive one */
            if (!localAddr) {
                localAddr = AmsNetId {conn.first->get()->ownIp};
            }
            conn.first->get()->refCount++;
            mapping[ams] = conn.first->get();
            return !conn.first->get()->ownIp;
        }

        return -1;
    } catch (std::exception& e) {
        lock.lock();
        connection_attempts.erase(ams);
        connection_attempt_events.notify_all();
        throw e;
    }
}